

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

const_iterator * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::upper_bound(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
              *this,key_type *key)

{
  bool bVar1;
  int iVar2;
  key_type *in_RSI;
  const_iterator *in_RDI;
  int slot;
  leaf_node *leaf;
  int slot_1;
  inner_node *inner;
  node *n;
  leaf_node *in_stack_ffffffffffffffa8;
  const_iterator *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *in_stack_ffffffffffffffd0;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *local_18;
  
  local_18 = (btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
              *)*in_RSI;
  this_00 = in_RDI;
  if (local_18 ==
      (btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
       *)0x0) {
    end(in_stack_ffffffffffffffd0);
  }
  else {
    while (bVar1 = node::isleafnode((node *)local_18), ((bVar1 ^ 0xffU) & 1) != 0) {
      iVar2 = btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
              ::
              find_upper<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::inner_node>
                        (in_stack_ffffffffffffffd0,
                         (inner_node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         ,in_RSI);
      local_18 = (btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                  *)(&local_18[2].m_stats.itemcount)[iVar2];
    }
    btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>
    ::
    find_upper<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::leaf_node>
              (local_18,(leaf_node *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_RSI);
    const_iterator::const_iterator(this_00,in_stack_ffffffffffffffa8,0);
  }
  return in_RDI;
}

Assistant:

const_iterator upper_bound(const key_type& key) const
        {
            const node *n = m_root;
            if (!n) return end();

            while(!n->isleafnode())
            {
                const inner_node *inner = static_cast<const inner_node*>(n);
                int slot = find_upper(inner, key);

                n = inner->childid[slot];
            }

            const leaf_node *leaf = static_cast<const leaf_node*>(n);

            int slot = find_upper(leaf, key);
            return const_iterator(leaf, slot);
        }